

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var-el.cpp
# Opt level: O0

Lit __thiscall IntVarEL::createSetLit(IntVarEL *this,vec<Lit> *head)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Lit LVar4;
  Lit *pLVar5;
  LitFlags *pLVar6;
  int *piVar7;
  uchar *puVar8;
  size_t *siglen;
  size_t *siglen_00;
  vec<Lit> *in_RSI;
  uchar *puVar9;
  long in_RDI;
  size_t in_R8;
  int i_2;
  int j;
  vec<Lit> ps;
  int v_1;
  ChannelInfo *ci_1;
  uint i_1;
  int v;
  ChannelInfo *ci;
  uint i;
  vec<int> holes;
  int upper_bound;
  int lower_bound;
  Lit q;
  IntVarEL *in_stack_fffffffffffffe28;
  vec<Lit> *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  uint in_stack_fffffffffffffe3c;
  vec<Lit> *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  undefined1 learnt;
  ChannelInfo in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffed8;
  uint in_stack_fffffffffffffedc;
  Lit *in_stack_fffffffffffffee0;
  int local_b8;
  uint local_b4;
  vec<Lit> local_90;
  int local_80;
  int local_7c;
  ChannelInfo local_78;
  undefined4 local_70;
  uint local_6c;
  int local_68;
  int local_64;
  ChannelInfo *local_60;
  uint local_58;
  uint local_54;
  int local_50;
  int local_4c;
  ChannelInfo *local_48;
  uint local_40;
  vec<int> local_30;
  int local_20;
  int local_1c;
  vec<Lit> *local_18;
  Lit local_4;
  
  local_1c = *(int *)(in_RDI + 0x60);
  local_20 = *(int *)(in_RDI + 100);
  local_18 = in_RSI;
  vec<int>::vec(&local_30);
  ::vec::operator_cast_to_Lit_((vec *)local_18);
  ::vec::operator_cast_to_Lit_((vec *)local_18);
  vec<Lit>::size(local_18);
  std::sort<Lit*>((Lit *)in_stack_fffffffffffffe40,
                  (Lit *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  local_40 = 0;
  while( true ) {
    uVar2 = local_40;
    uVar1 = vec<Lit>::size(local_18);
    puVar8 = (uchar *)(ulong)uVar1;
    if (uVar1 <= uVar2) break;
    pLVar5 = vec<Lit>::operator[](local_18,local_40);
    local_4c = pLVar5->x;
    uVar2 = ::var((Lit)local_4c);
    local_48 = vec<ChannelInfo>::operator[](&sat.c_info,uVar2);
    if (*(int *)local_48 < 0) {
      local_50 = local_48->val;
      puVar9 = (uchar *)(ulong)local_40;
      pLVar5 = vec<Lit>::operator[](local_18,local_40);
      local_54 = pLVar5->x;
      uVar2 = sign((EVP_PKEY_CTX *)(ulong)local_54,puVar9,siglen,puVar8,in_R8);
      if ((uVar2 & 1) == 0) {
        if (local_1c < local_50 + 1) {
          local_1c = local_50 + 1;
        }
      }
      else if (local_50 < local_20) {
        local_20 = local_50;
      }
    }
    local_40 = local_40 + 1;
  }
  local_58 = 0;
  do {
    uVar2 = local_58;
    uVar1 = vec<Lit>::size(local_18);
    puVar8 = (uchar *)(ulong)uVar1;
    if (uVar1 <= uVar2) {
      if (local_20 < local_1c) {
        printf("Domain wipeout??\n");
      }
      fflush(_stdout);
      if ((local_1c == *(int *)(in_RDI + 0x60)) && (uVar2 = vec<int>::size(&local_30), uVar2 == 0))
      {
        local_4 = getGELit(in_stack_fffffffffffffe28,0);
        local_70 = 1;
      }
      else if ((local_20 == *(int *)(in_RDI + 100)) &&
              (uVar2 = vec<int>::size(&local_30), uVar2 == 0)) {
        local_4 = getLELit(in_stack_fffffffffffffe28,0);
        local_70 = 1;
      }
      else {
        local_78 = ::ci_null;
        iVar3 = SAT::getLazyVar((SAT *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48)
                                ,in_stack_fffffffffffffe50);
        Lit::Lit(&local_4,iVar3,true);
        local_7c = local_4.x;
        uVar2 = ::var(local_4);
        pLVar6 = vec<LitFlags>::operator[](&sat.flags,uVar2);
        LitFlags::setUIPable(pLVar6,false);
        local_80 = local_4.x;
        uVar2 = ::var(local_4);
        pLVar6 = vec<LitFlags>::operator[](&sat.flags,uVar2);
        LitFlags::setLearnable(pLVar6,false);
        vec<Lit>::vec(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
        LVar4 = operator~((Lit)0x17182f);
        pLVar5 = vec<Lit>::operator[](&local_90,1);
        pLVar5->x = LVar4.x;
        if (local_1c == *(int *)(in_RDI + 0x60)) {
          vec<int>::operator[](&local_30,0);
          getGELit(in_stack_fffffffffffffe28,0);
          operator~((Lit)0x1718d4);
          SAT::addClause((SAT *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                         (Lit)(int)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                         (Lit)(int)in_stack_fffffffffffffee0);
          piVar7 = vec<int>::operator[](&local_30,0);
          local_1c = *piVar7;
        }
        if (local_20 == *(int *)(in_RDI + 100)) {
          vec<int>::last(&local_30);
          getLELit(in_stack_fffffffffffffe28,0);
          operator~((Lit)0x1719b8);
          SAT::addClause((SAT *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                         (Lit)(int)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                         (Lit)(int)in_stack_fffffffffffffee0);
          in_stack_fffffffffffffe50 = (ChannelInfo)vec<int>::last(&local_30);
          local_20 = *(int *)in_stack_fffffffffffffe50;
        }
        local_b4 = 0;
        for (local_b8 = local_1c; local_b8 <= local_20; local_b8 = local_b8 + 1) {
          uVar2 = local_b4;
          uVar1 = vec<int>::size(&local_30);
          if (((int)uVar2 < (int)uVar1) &&
             (iVar3 = local_b8, piVar7 = vec<int>::operator[](&local_30,local_b4), iVar3 == *piVar7)
             ) {
            local_b4 = local_b4 + 1;
          }
          else {
            learnt = (undefined1)(uVar1 >> 0x18);
            LVar4 = getNELit(in_stack_fffffffffffffe28,0);
            in_stack_fffffffffffffe30 = (vec<Lit> *)vec<Lit>::operator[](&local_90,0);
            in_stack_fffffffffffffe30->sz = LVar4.x;
            in_stack_fffffffffffffe28 =
                 (IntVarEL *)
                 ::Clause_new<vec<Lit>>((vec<Lit> *)in_stack_fffffffffffffe50,(bool)learnt);
            SAT::addClause((SAT *)head,_upper_bound,holes.data._7_1_);
          }
        }
        local_70 = 1;
        vec<Lit>::~vec(in_stack_fffffffffffffe30);
      }
LAB_00171b49:
      vec<int>::~vec((vec<int> *)in_stack_fffffffffffffe30);
      return (Lit)local_4.x;
    }
    in_stack_fffffffffffffee0 = vec<Lit>::operator[](local_18,local_58);
    local_64 = in_stack_fffffffffffffee0->x;
    in_stack_fffffffffffffedc = ::var((Lit)local_64);
    local_60 = vec<ChannelInfo>::operator[](&sat.c_info,in_stack_fffffffffffffedc);
    if (-1 < *(int *)local_60) {
      local_68 = local_60->val;
      puVar9 = (uchar *)(ulong)local_58;
      pLVar5 = vec<Lit>::operator[](local_18,local_58);
      local_6c = pLVar5->x;
      uVar2 = sign((EVP_PKEY_CTX *)(ulong)local_6c,puVar9,siglen_00,puVar8,in_R8);
      if ((uVar2 & 1) == 0) {
        local_4 = getNELit(in_stack_fffffffffffffe28,0);
        local_70 = 1;
        goto LAB_00171b49;
      }
      if ((local_1c <= local_68) && (local_68 <= local_20)) {
        if (local_68 == local_1c) {
          local_1c = local_1c + 1;
        }
        else if (local_68 == local_20) {
          local_20 = local_20 + -1;
        }
        else {
          vec<int>::push((vec<int> *)in_stack_fffffffffffffe40,
                         (int *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        }
      }
    }
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

Lit IntVarEL::createSetLit(vec<Lit>& head) {
	// lb, ub and holes, which together cause the conflict
	int lower_bound = lit_min;
	int upper_bound = lit_max;
	vec<int> holes;

	std::sort((Lit*)head, (Lit*)head + head.size());

	// process bounds lits first
	for (unsigned int i = 0; i < head.size(); i++) {
		const ChannelInfo& ci = sat.c_info[var(head[i])];
		if (ci.val_type == 0) {
			continue;
		}
		const int v = ci.val;
		if (sign(head[i])) {
			if (v < upper_bound) {
				upper_bound = v;
			}
		} else {
			if (v + 1 > lower_bound) {
				lower_bound = v + 1;
			}
		}
	}

	// process val lits
	for (unsigned int i = 0; i < head.size(); i++) {
		const ChannelInfo& ci = sat.c_info[var(head[i])];
		if (ci.val_type == 1) {
			continue;
		}
		const int v = ci.val;
		if (sign(head[i])) {
			if (v < lower_bound || v > upper_bound) {
				continue;
			}
			if (v == lower_bound) {
				lower_bound++;
				continue;
			}
			if (v == upper_bound) {
				upper_bound--;
				continue;
			}
			holes.push(v);
		} else {
			return getNELit(v);
		}
	}

	if (lower_bound > upper_bound) {
		printf("Domain wipeout??\n");
		assert(false);
	}

	//	printf("lower_bound = %d, upper_bound = %d\n", lower_bound, upper_bound);
	//	for (int i = 0; i < holes.size(); i++) printf("%d ", holes[i]); printf("\n");

	fflush(stdout);

	// Check cases where an original lit is sufficient

	if (lower_bound == lit_min && holes.size() == 0) {
		return getGELit(upper_bound + 1);
	}
	if (upper_bound == lit_max && holes.size() == 0) {
		return getLELit(lower_bound - 1);
	}

	// Create new lit that complements failure set

	Lit q = Lit(sat.getLazyVar(ci_null), true);
	sat.flags[var(q)].setUIPable(false);
	sat.flags[var(q)].setLearnable(false);

	vec<Lit> ps(2);
	ps[1] = ~q;

	if (lower_bound == lit_min) {
		// can use bounds lit for lower bound
		sat.addClause(getGELit(holes[0]), ~q);
		lower_bound = holes[0];
		//		printf("GE: %d\n", holes[0]);
	}
	if (upper_bound == lit_max) {
		// can use bounds lit for upper bound
		sat.addClause(getLELit(holes.last()), ~q);
		upper_bound = holes.last();
		//		printf("LE: %d\n", holes.last());
	}
	int j = 0;
	for (int i = lower_bound; i <= upper_bound; i++) {
		if (j < static_cast<int>(holes.size()) && i == holes[j]) {
			j++;
			continue;
		}
		ps[0] = getNELit(i);
		sat.addClause(*Clause_new(ps), true);
		//		printf("NE: %d\n", i);
	}

	//	printf("New lit = %d\n", toInt(q));

	return q;
}